

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idec_dec.c
# Opt level: O2

uint8_t * WebPIDecGetRGB(WebPIDecoder *idec,int *last_y,int *width,int *height,int *stride)

{
  WebPDecBuffer *pWVar1;
  uint8_t *puVar2;
  
  pWVar1 = GetOutputBuffer(idec);
  if ((pWVar1 == (WebPDecBuffer *)0x0) || (MODE_rgbA_4444 < pWVar1->colorspace)) {
    puVar2 = (uint8_t *)0x0;
  }
  else {
    if (last_y != (int *)0x0) {
      *last_y = (idec->params_).last_y;
    }
    if (width != (int *)0x0) {
      *width = pWVar1->width;
    }
    if (height != (int *)0x0) {
      *height = pWVar1->height;
    }
    if (stride != (int *)0x0) {
      *stride = (pWVar1->u).RGBA.stride;
    }
    puVar2 = (pWVar1->u).RGBA.rgba;
  }
  return puVar2;
}

Assistant:

WEBP_NODISCARD uint8_t* WebPIDecGetRGB(const WebPIDecoder* idec, int* last_y,
                                       int* width, int* height, int* stride) {
  const WebPDecBuffer* const src = GetOutputBuffer(idec);
  if (src == NULL) return NULL;
  if (src->colorspace >= MODE_YUV) {
    return NULL;
  }

  if (last_y != NULL) *last_y = idec->params_.last_y;
  if (width != NULL) *width = src->width;
  if (height != NULL) *height = src->height;
  if (stride != NULL) *stride = src->u.RGBA.stride;

  return src->u.RGBA.rgba;
}